

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_manager.cpp
# Opt level: O0

unique_ptr<duckdb::Logger,_std::default_delete<duckdb::Logger>,_true> __thiscall
duckdb::LogManager::CreateLogger
          (LogManager *this,LoggingContext context,bool thread_safe,bool mutable_settings)

{
  byte bVar1;
  byte in_CL;
  byte bVar2;
  byte in_DL;
  RegisteredLoggingContext *in_RSI;
  LogConfig *in_RDI;
  RegisteredLoggingContext registered_logging_context;
  unique_lock<std::mutex> lck;
  _Head_base<0UL,_duckdb::Logger_*,_false> this_00;
  LogManager *in_stack_ffffffffffffff78;
  LoggingContext *in_stack_ffffffffffffffb8;
  LogManager *in_stack_ffffffffffffffc0;
  undefined6 in_stack_ffffffffffffffe8;
  RegisteredLoggingContext *args_1;
  LogConfig *args;
  
  bVar2 = in_DL & 1;
  bVar1 = in_CL & 1;
  this_00._M_head_impl = (Logger *)in_RDI;
  args_1 = in_RSI;
  args = in_RDI;
  ::std::unique_lock<std::mutex>::unique_lock
            ((unique_lock<std::mutex> *)in_RDI,(mutex_type *)in_RDI);
  RegisterLoggingContextInternal(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  if ((bVar1 & 1) == 0) {
    if ((in_RSI[1].context.scope & 1) == 0) {
      make_uniq<duckdb::NopLogger,duckdb::LogManager&>(in_stack_ffffffffffffff78);
      unique_ptr<duckdb::Logger,std::default_delete<duckdb::Logger>,true>::
      unique_ptr<duckdb::NopLogger,std::default_delete<std::unique_ptr<duckdb::Logger,std::default_delete<duckdb::Logger>>>,void>
                ((unique_ptr<duckdb::Logger,_std::default_delete<duckdb::Logger>,_true> *)
                 this_00._M_head_impl,
                 (unique_ptr<duckdb::NopLogger,_std::default_delete<duckdb::NopLogger>_> *)in_RDI);
      unique_ptr<duckdb::NopLogger,_std::default_delete<duckdb::NopLogger>,_true>::~unique_ptr
                ((unique_ptr<duckdb::NopLogger,_std::default_delete<duckdb::NopLogger>,_true> *)
                 0x61e89b);
    }
    else {
      make_uniq<duckdb::ThreadSafeLogger,duckdb::LogConfig&,duckdb::RegisteredLoggingContext&,duckdb::LogManager&>
                (args,args_1,(LogManager *)CONCAT17(bVar2,CONCAT16(bVar1,in_stack_ffffffffffffffe8))
                );
      unique_ptr<duckdb::Logger,std::default_delete<duckdb::Logger>,true>::
      unique_ptr<duckdb::ThreadSafeLogger,std::default_delete<std::unique_ptr<duckdb::Logger,std::default_delete<duckdb::Logger>>>,void>
                ((unique_ptr<duckdb::Logger,_std::default_delete<duckdb::Logger>,_true> *)
                 this_00._M_head_impl,
                 (unique_ptr<duckdb::ThreadSafeLogger,_std::default_delete<duckdb::ThreadSafeLogger>_>
                  *)in_RDI);
      unique_ptr<duckdb::ThreadSafeLogger,_std::default_delete<duckdb::ThreadSafeLogger>,_true>::
      ~unique_ptr((unique_ptr<duckdb::ThreadSafeLogger,_std::default_delete<duckdb::ThreadSafeLogger>,_true>
                   *)0x61e8e6);
    }
  }
  else {
    make_uniq<duckdb::MutableLogger,duckdb::LogConfig&,duckdb::RegisteredLoggingContext&,duckdb::LogManager&>
              (args,args_1,(LogManager *)CONCAT17(bVar2,CONCAT16(bVar1,in_stack_ffffffffffffffe8)));
    unique_ptr<duckdb::Logger,std::default_delete<duckdb::Logger>,true>::
    unique_ptr<duckdb::MutableLogger,std::default_delete<std::unique_ptr<duckdb::Logger,std::default_delete<duckdb::Logger>>>,void>
              ((unique_ptr<duckdb::Logger,_std::default_delete<duckdb::Logger>,_true> *)
               this_00._M_head_impl,
               (unique_ptr<duckdb::MutableLogger,_std::default_delete<duckdb::MutableLogger>_> *)
               in_RDI);
    unique_ptr<duckdb::MutableLogger,_std::default_delete<duckdb::MutableLogger>,_true>::~unique_ptr
              ((unique_ptr<duckdb::MutableLogger,_std::default_delete<duckdb::MutableLogger>,_true>
                *)0x61e83a);
  }
  ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)this_00._M_head_impl);
  return (unique_ptr<duckdb::Logger,_std::default_delete<duckdb::Logger>_>)
         (_Tuple_impl<0UL,_duckdb::Logger_*,_std::default_delete<duckdb::Logger>_>)
         this_00._M_head_impl;
}

Assistant:

unique_ptr<Logger> LogManager::CreateLogger(LoggingContext context, bool thread_safe, bool mutable_settings) {
	unique_lock<mutex> lck(lock);

	auto registered_logging_context = RegisterLoggingContextInternal(context);

	if (mutable_settings) {
		return make_uniq<MutableLogger>(config, registered_logging_context, *this);
	}
	if (!config.enabled) {
		return make_uniq<NopLogger>(*this);
	}
	if (!thread_safe) {
		// TODO: implement ThreadLocalLogger and return it here
	}
	return make_uniq<ThreadSafeLogger>(config, registered_logging_context, *this);
}